

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O0

int Fra_SmlCheckOutput(Fra_Man_t *p)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  Fra_Man_t *p_local;
  
  pAVar4 = Aig_ManCo(p->pManAig,0);
  pAVar5 = Aig_ObjFanin0(pAVar4);
  uVar1 = *(ulong *)&pAVar5->field_0x18;
  uVar2 = Aig_ObjFaninC0(pAVar4);
  if (((uint)(uVar1 >> 3) & 1) != uVar2) {
    __assert_fail("Aig_ObjFanin0(pObj)->fPhase == (unsigned)Aig_ObjFaninC0(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSim.c"
                  ,0x14c,"int Fra_SmlCheckOutput(Fra_Man_t *)");
  }
  local_24 = 0;
  while( true ) {
    iVar3 = Vec_PtrSize(p->pManAig->vCos);
    if (iVar3 <= local_24) {
      return 0;
    }
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pManAig->vCos,local_24);
    pAVar5 = Aig_ObjFanin0(pAVar4);
    iVar3 = Fra_SmlNodeIsConst(pAVar5);
    if (iVar3 == 0) break;
    local_24 = local_24 + 1;
  }
  Fra_SmlCheckOutputSavePattern(p,pAVar4);
  return 1;
}

Assistant:

int Fra_SmlCheckOutput( Fra_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    // make sure the reference simulation pattern does not detect the bug
    pObj = Aig_ManCo( p->pManAig, 0 );
    assert( Aig_ObjFanin0(pObj)->fPhase == (unsigned)Aig_ObjFaninC0(pObj) ); 
    Aig_ManForEachCo( p->pManAig, pObj, i )
    {
        if ( !Fra_SmlNodeIsConst( Aig_ObjFanin0(pObj) ) )
        {
            // create the counter-example from this pattern
            Fra_SmlCheckOutputSavePattern( p, pObj );
            return 1;
        }
    }
    return 0;
}